

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# router.h
# Opt level: O3

void __thiscall
rest_rpc::rpc_service::router::
register_handler<false,void(*)(std::weak_ptr<rest_rpc::rpc_service::connection>)>
          (router *this,string *name,_func_void_weak_ptr<rest_rpc::rpc_service::connection> *f,
          bool pub)

{
  char *pcVar1;
  char *message;
  uint uVar2;
  iterator iVar3;
  mapped_type *this_00;
  invalid_argument *this_01;
  long lVar4;
  IntermediateData IVar5;
  uint32_t key;
  uint local_38;
  uint local_34;
  anon_class_8_1_54a39806_conflict4 local_30;
  
  message = (name->_M_dataplus)._M_p;
  lVar4 = 0;
  do {
    pcVar1 = message + lVar4;
    lVar4 = lVar4 + 1;
  } while (*pcVar1 != '\0');
  IVar5 = MD5::MD5CE::ProcessMessage(message,(int)lVar4 - 1);
  uVar2 = IVar5.a;
  local_38 = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
  iVar3 = std::
          _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->key2func_name_)._M_h,&local_38);
  if (iVar3.
      super__Node_iterator_base<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
      ._M_cur == (__node_type *)0x0) {
    std::
    _Hashtable<unsigned_int,std::pair<unsigned_int_const,std::__cxx11::string>,std::allocator<std::pair<unsigned_int_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
    ::_M_emplace<unsigned_int&,std::__cxx11::string_const&>
              ((_Hashtable<unsigned_int,std::pair<unsigned_int_const,std::__cxx11::string>,std::allocator<std::pair<unsigned_int_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                *)&this->key2func_name_,&local_38,name);
    local_34 = local_38;
    local_30.f = f;
    this_00 = std::__detail::
              _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::function<void_(std::weak_ptr<rest_rpc::rpc_service::connection>,_nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>,_std::allocator<std::pair<const_unsigned_int,_std::function<void_(std::weak_ptr<rest_rpc::rpc_service::connection>,_nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::function<void_(std::weak_ptr<rest_rpc::rpc_service::connection>,_nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>,_std::allocator<std::pair<const_unsigned_int,_std::function<void_(std::weak_ptr<rest_rpc::rpc_service::connection>,_nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)this,&local_34);
    std::
    function<void(std::weak_ptr<rest_rpc::rpc_service::connection>,nonstd::sv_lite::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string&)>
    ::operator=((function<void(std::weak_ptr<rest_rpc::rpc_service::connection>,nonstd::sv_lite::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string&)>
                 *)this_00,&local_30);
    return;
  }
  this_01 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this_01,"duplicate registration key !");
  __cxa_throw(this_01,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

void register_handler(std::string const &name, Function f, bool pub = false) {
    uint32_t key = MD5::MD5Hash32(name.data());
    if (key2func_name_.find(key) != key2func_name_.end()) {
      throw std::invalid_argument("duplicate registration key !");
    } else {
      key2func_name_.emplace(key, name);
      return register_nonmember_func<is_pub>(key, std::move(f));
    }
  }